

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

void __thiscall Minisat::OnlineProofChecker::fullCheck(OnlineProofChecker *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  Lit p_00;
  uint *puVar6;
  ostream *poVar7;
  Watcher *pWVar8;
  ostream *in_RDI;
  Clause *c_1;
  CRef wcr_1;
  int j_2;
  vec<Minisat::Watcher> *ws_1;
  Lit l_1;
  int p;
  Var v;
  CRef wcr;
  int j_1;
  bool didFind;
  vec<Minisat::Watcher> *ws;
  Lit l;
  int j;
  Clause *c;
  CRef cr;
  int i;
  Ref in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int iVar9;
  Lit in_stack_ffffffffffffff88;
  Lit in_stack_ffffffffffffff8c;
  Lit in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Lit LVar10;
  Lit local_64;
  Clause *local_60;
  CRef local_58;
  int local_54;
  vec<Minisat::Watcher> *local_50;
  Lit local_48;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  byte local_31;
  vec<Minisat::Watcher> *local_30;
  int local_24;
  int local_20;
  int local_1c;
  Clause *local_18;
  uint local_10;
  int local_c;
  
  local_c = 0;
  do {
    iVar9 = local_c;
    iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x20));
    if (iVar2 <= iVar9) {
      local_40 = 0;
      while (iVar2 = local_40, iVar4 = nVars((OnlineProofChecker *)0x117d5d), iVar2 < iVar4) {
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          local_48 = mkLit(local_40,local_44 == 1);
          local_50 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                     ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                   *)in_RDI,(Lit *)CONCAT44(iVar9,in_stack_ffffffffffffff78));
          local_54 = 0;
          while (iVar4 = local_54, iVar5 = vec<Minisat::Watcher>::size(local_50), iVar4 < iVar5) {
            pWVar8 = vec<Minisat::Watcher>::operator[](local_50,local_54);
            local_58 = pWVar8->cref;
            local_60 = ClauseAllocator::operator[]
                                 ((ClauseAllocator *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff6c
                                 );
            local_64 = Clause::operator[](local_60,0);
            LVar10.x = local_48.x;
            p_00 = operator~(local_48);
            bVar1 = Lit::operator!=(&local_64,p_00);
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c & 0xffffff;
            if (bVar1) {
              in_stack_ffffffffffffff90 = Clause::operator[](local_60,1);
              in_stack_ffffffffffffff88.x = local_48.x;
              in_stack_ffffffffffffff8c = operator~(local_48);
              bVar1 = Lit::operator!=((Lit *)&stack0xffffffffffffff90,in_stack_ffffffffffffff8c);
              in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
            }
            if ((char)(in_stack_ffffffffffffff6c >> 0x18) != '\0') {
              poVar7 = std::operator<<((ostream *)&std::cerr,"wrong literals for clause [");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_58);
              std::operator<<(poVar7,"] ");
              poVar7 = operator<<(in_RDI,(Clause *)CONCAT44(iVar9,in_stack_ffffffffffffff78));
              std::operator<<(poVar7," are watched. Found in list for ");
              poVar7 = operator<<((ostream *)CONCAT44(LVar10.x,in_stack_ffffffffffffff90.x),
                                  (Lit *)CONCAT44(in_stack_ffffffffffffff8c.x,
                                                  in_stack_ffffffffffffff88.x));
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            local_54 = local_54 + 1;
          }
        }
        local_40 = local_40 + 1;
      }
      return;
    }
    puVar6 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x20),local_c);
    local_10 = *puVar6;
    local_18 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    uVar3 = Clause::mark(local_18);
    if (uVar3 == 0) {
      iVar2 = Clause::size(local_18);
      if (iVar2 == 1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"there should not be unit clauses! [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_10);
        std::operator<<(poVar7,"]");
        poVar7 = operator<<(in_RDI,(Clause *)CONCAT44(iVar9,in_stack_ffffffffffffff78));
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
          local_24 = (int)Clause::operator[](local_18,local_1c);
          local_20 = (int)operator~((Lit)local_24);
          local_30 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                     ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                   *)in_RDI,(Lit *)CONCAT44(iVar9,in_stack_ffffffffffffff78));
          local_31 = 0;
          local_38 = 0;
          while (in_stack_ffffffffffffff78 = local_38, iVar2 = vec<Minisat::Watcher>::size(local_30)
                , in_stack_ffffffffffffff78 < iVar2) {
            pWVar8 = vec<Minisat::Watcher>::operator[](local_30,local_38);
            local_3c = pWVar8->cref;
            if (local_3c == local_10) {
              local_31 = 1;
              break;
            }
            local_38 = local_38 + 1;
          }
          if ((local_31 & 1) == 0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"could not find clause[");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_10);
            std::operator<<(poVar7,"] ");
            poVar7 = operator<<(in_RDI,(Clause *)CONCAT44(iVar9,in_stack_ffffffffffffff78));
            std::operator<<(poVar7," in watcher for lit ");
            poVar7 = operator<<((ostream *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90.x),
                                (Lit *)CONCAT44(in_stack_ffffffffffffff8c.x,
                                                in_stack_ffffffffffffff88.x));
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

inline void OnlineProofChecker::fullCheck()
{
    for (int i = 0; i < clauses.size(); ++i) {
        const CRef cr = clauses[i];
        const Clause &c = ca[cr];
        if (c.mark()) {
            continue;
        }

        if (c.size() == 1) {
            std::cerr << "there should not be unit clauses! [" << cr << "]" << c << std::endl;
        } else {
            for (int j = 0; j < 2; ++j) {
                const Lit l = ~c[j];
                vec<Watcher> &ws = watches[l];
                bool didFind = false;
                for (int j = 0; j < ws.size(); ++j) {
                    CRef wcr = ws[j].cref;
                    if (wcr == cr) {
                        didFind = true;
                        break;
                    }
                }
                if (!didFind) {
                    std::cerr << "could not find clause[" << cr << "] " << c << " in watcher for lit " << l << std::endl;
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];
                if (c[0] != ~l && c[1] != ~l) {
                    std::cerr << "wrong literals for clause [" << wcr << "] " << c << " are watched. Found in list for "
                              << l << std::endl;
                }
            }
        }
    }
}